

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void container_printf(container_t *c,uint8_t type)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,type);
  if (uVar3 == 4) {
    uVar3 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar3 == '\x03') {
    if (0 < ((array_container_t *)c)->cardinality) {
      lVar5 = 0;
      do {
        uVar1 = ((array_container_t *)c)->array[lVar5 * 2];
        printf("[%d,%d]",(ulong)uVar1,
               (ulong)((uint)((array_container_t *)c)->array[lVar5 * 2 + 1] + (uint)uVar1));
        lVar5 = lVar5 + 1;
      } while (lVar5 < ((array_container_t *)c)->cardinality);
    }
    return;
  }
  if ((uVar3 & 0xff) != 2) {
    putchar(0x7b);
    bVar4 = true;
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar6 = *(ulong *)(((array_container_t *)c)->array + lVar5 * 4);
      if (uVar6 != 0) {
        __format = ",%u";
        if (bVar4) {
          __format = "%u";
        }
        do {
          lVar2 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          bVar4 = false;
          printf(__format,(ulong)((uint)lVar2 | uVar3));
          uVar6 = uVar6 & uVar6 - 1;
          __format = ",%u";
        } while (uVar6 != 0);
      }
      uVar3 = uVar3 + 0x40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
    putchar(0x7d);
    return;
  }
  array_container_printf((array_container_t *)c);
  return;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}